

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.h
# Opt level: O1

void __thiscall
jaegertracing::agent::thrift::AgentClient::AgentClient
          (AgentClient *this,shared_ptr<apache::thrift::protocol::TProtocol> *prot)

{
  shared_ptr<apache::thrift::protocol::TProtocol> local_20;
  
  *(undefined ***)this = &PTR__AgentClient_00276418;
  (this->piprot_).
  super___shared_ptr<apache::thrift::protocol::TProtocol,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->piprot_).
  super___shared_ptr<apache::thrift::protocol::TProtocol,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->poprot_).
  super___shared_ptr<apache::thrift::protocol::TProtocol,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->poprot_).
  super___shared_ptr<apache::thrift::protocol::TProtocol,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_20.super___shared_ptr<apache::thrift::protocol::TProtocol,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (prot->
           super___shared_ptr<apache::thrift::protocol::TProtocol,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_20.super___shared_ptr<apache::thrift::protocol::TProtocol,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (prot->super___shared_ptr<apache::thrift::protocol::TProtocol,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if (local_20.super___shared_ptr<apache::thrift::protocol::TProtocol,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_20.super___shared_ptr<apache::thrift::protocol::TProtocol,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_20.
            super___shared_ptr<apache::thrift::protocol::TProtocol,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_20.super___shared_ptr<apache::thrift::protocol::TProtocol,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_20.
            super___shared_ptr<apache::thrift::protocol::TProtocol,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  setProtocol(this,&local_20);
  if (local_20.super___shared_ptr<apache::thrift::protocol::TProtocol,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.
               super___shared_ptr<apache::thrift::protocol::TProtocol,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

AgentClient(std::shared_ptr< ::apache::thrift::protocol::TProtocol> prot) {
    setProtocol(prot);
  }